

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
     ::format_custom_arg<fmt::v5::arg_join<int*,wchar_t>>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
               *ctx)

{
  size_t *psVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  iterator iVar4;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>
  handler;
  error_handler local_89;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>
  local_88;
  dynamic_format_specs<wchar_t> local_68;
  
  local_88.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
  .super_specs_setter<wchar_t>.specs_ = &local_68.super_basic_format_specs<wchar_t>;
  local_68.super_basic_format_specs<wchar_t>.super_align_spec.width_ = 0;
  local_68.super_basic_format_specs<wchar_t>.super_align_spec.fill_ = L' ';
  local_68.super_basic_format_specs<wchar_t>.super_align_spec.align_ = ALIGN_DEFAULT;
  local_68.super_basic_format_specs<wchar_t>.super_core_format_specs.precision = -1;
  local_68.super_basic_format_specs<wchar_t>.super_core_format_specs.flags = '\0';
  local_68.super_basic_format_specs<wchar_t>.super_core_format_specs.type = '\0';
  local_68.width_ref.kind = NONE;
  local_68.width_ref.field_1.index = 0;
  local_68.precision_ref.kind = NONE;
  local_68.precision_ref.field_1.index = 0;
  local_88.arg_type_ = int_type;
  pwVar3 = (ctx->
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
           ).parse_context_.format_str_.data_;
  local_88.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
  .specs_ = (dynamic_format_specs<wchar_t> *)
            local_88.
            super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
            .super_specs_setter<wchar_t>.specs_;
  local_88.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
  .context_ = (basic_parse_context<wchar_t,_fmt::v5::internal::error_handler> *)ctx;
  pwVar3 = parse_format_specs<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,fmt::v5::internal::error_handler>>>&>
                     (pwVar3,pwVar3 + (ctx->
                                      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                                      ).parse_context_.format_str_.size_,&local_88);
  if (((0x36 < (byte)local_68.super_basic_format_specs<wchar_t>.super_core_format_specs.type - 0x42)
      || ((0x40300500400001U >>
           ((ulong)((byte)local_68.super_basic_format_specs<wchar_t>.super_core_format_specs.type -
                   0x42) & 0x3f) & 1) == 0)) &&
     (local_68.super_basic_format_specs<wchar_t>.super_core_format_specs.type != 0)) {
    error_handler::on_error(&local_89,"invalid type specifier");
  }
  pwVar2 = (ctx->
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
           ).parse_context_.format_str_.data_;
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
  ).parse_context_.format_str_.data_ = pwVar3;
  psVar1 = &(ctx->
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
            ).parse_context_.format_str_.size_;
  *psVar1 = *psVar1 - ((long)pwVar3 - (long)pwVar2 >> 2);
  iVar4 = formatter<fmt::v5::arg_join<int*,wchar_t>,wchar_t,void>::
          format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
                    ((formatter<fmt::v5::arg_join<int*,wchar_t>,wchar_t,void> *)&local_68,
                     (arg_join<int_*,_wchar_t> *)arg,ctx);
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
  ).out_.container = iVar4.container;
  return;
}

Assistant:

static void format_custom_arg(const void *arg, Context &ctx) {
    // Get the formatter type through the context to allow different contexts
    // have different extension points, e.g. `formatter<T>` for `format` and
    // `printf_formatter<T>` for `printf`.
    typename Context::template formatter_type<T>::type f;
    auto &&parse_ctx = ctx.parse_context();
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }